

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp analyze_lambda(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  int iVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  char *message;
  sexp x_00;
  sexp *ppsVar6;
  sexp tmp;
  sexp local_b8;
  sexp ctx2;
  sexp body;
  sexp defs;
  sexp local_98;
  sexp_gc_var_t local_90;
  sexp_gc_var_t local_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_90.var = &local_b8;
  local_b8 = (sexp)0x43e;
  local_40.var = &body;
  body = (sexp)&DAT_0000043e;
  local_50.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_60.var = &local_98;
  local_98 = (sexp)&DAT_0000043e;
  local_70.var = &defs;
  defs = (sexp)&DAT_0000043e;
  local_80.var = &ctx2;
  ctx2 = (sexp)&DAT_0000043e;
  local_40.next = &local_90;
  local_90.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  local_60.next = &local_50;
  local_70.next = &local_60;
  local_80.next = &local_70;
  (ctx->value).context.saves = &local_80;
  psVar5 = (x->value).type.cpl;
  if ((((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 6)) &&
      (psVar3 = (psVar5->value).type.cpl, ((ulong)psVar3 & 3) == 0)) && (psVar3->tag == 6)) {
    psVar3 = sexp_length_op((sexp)0x0,(sexp)0x0,1,(psVar5->value).type.name);
    psVar5 = (x->value).type.cpl;
    while ((psVar5 = (psVar5->value).type.name, ((ulong)psVar5 & 3) == 0 && (psVar5->tag == 6))) {
      psVar4 = (psVar5->value).type.name;
      iVar2 = sexp_idp(psVar4);
      if (iVar2 == 0) goto LAB_0012a764;
      if (((long)psVar3 < 200) &&
         (psVar4 = sexp_memq_op(ctx,(sexp)0x0,2,psVar4,(psVar5->value).type.cpl),
         psVar4 != (sexp)&DAT_0000003e)) goto LAB_0012a75b;
      psVar5 = (sexp)&psVar5->value;
    }
    if (psVar5 == (sexp)&DAT_0000023e) {
LAB_0012a76d:
      tmp = sexp_copy_list_op(ctx,(sexp)0x0,1,(((x->value).type.cpl)->value).type.name);
      local_b8 = sexp_make_lambda(ctx,tmp);
      if ((((ulong)local_b8 & 3) != 0) || (psVar5 = local_b8, local_b8->tag != 0x13)) {
        psVar5 = (x->value).type.slots;
        (local_b8->value).opcode.dl = psVar5;
        if ((((ulong)psVar5 & 3) != 0 || psVar5 == (sexp)0x0) || (psVar5->tag != 6)) {
          psVar5 = (((x->value).type.cpl)->value).type.slots;
          (local_b8->value).opcode.dl = psVar5;
        }
        if (((psVar5 == (sexp)0x0) || (((ulong)psVar5 & 3) != 0)) || (psVar5->tag != 6)) {
          (local_b8->value).opcode.dl =
               (((((x->value).type.cpl)->value).type.cpl)->value).type.slots;
        }
        ctx2 = sexp_make_child_context(ctx,local_b8);
        if ((((ulong)ctx2 & 3) != 0) || (psVar5 = ctx2, ctx2->tag != 0x13)) {
          tmp = sexp_flatten_dot(ctx2,(local_b8->value).type.cpl);
          psVar5 = sexp_extend_env(ctx2,(ctx2->value).type.cpl,tmp,local_b8);
          (ctx2->value).type.cpl = psVar5;
          if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
            (psVar5->value).type.cpl = local_b8;
            body = analyze_seq(ctx2,(((x->value).type.cpl)->value).type.cpl,depth,1);
            if ((((ulong)body & 3) != 0) || (psVar5 = body, body->tag != 0x13)) {
              defs = (sexp)&DAT_0000023e;
              ppsVar6 = &(local_b8->value).type.getters;
              while ((psVar3 = *ppsVar6, ((ulong)psVar3 & 3) == 0 && (psVar3->tag == 6))) {
                tmp = (psVar3->value).type.name;
                psVar5 = (tmp->value).type.name;
                psVar4 = (tmp->value).type.cpl;
                x_00 = (psVar5->value).type.name;
                if ((((ulong)x_00 & 3) == 0) && (x_00->tag == 6)) {
                  psVar1 = (x_00->value).type.name;
                  tmp = sexp_cons_op(psVar4,(sexp)0x0,2,(x_00->value).type.cpl,
                                     (psVar5->value).type.cpl);
                  tmp = sexp_cons_op(psVar4,(sexp)0x0,2,(sexp)&DAT_0000043e,tmp);
                  (tmp->value).type.slots =
                       (((((psVar3->value).type.name)->value).type.name)->value).type.slots;
                  psVar5 = analyze_lambda(psVar4,tmp,depth);
                  x_00 = psVar1;
                }
                else {
                  psVar5 = analyze(psVar4,(((psVar5->value).type.cpl)->value).type.name,depth,0);
                }
                if (((ulong)psVar5 & 3) == 0) {
                  if (psVar5->tag == 0x1c) {
                    (psVar5->value).type.name = x_00;
                  }
                  else if (psVar5->tag == 0x13) goto LAB_0012a70a;
                }
                local_98 = psVar5;
                tmp = analyze_var_ref(psVar4,x_00,(sexp_conflict *)0x0);
                if (((((ulong)tmp & 3) == 0) && (psVar5 = tmp, tmp->tag == 0x13)) ||
                   ((tmp = sexp_make_set(psVar4,tmp,local_98), ((ulong)tmp & 3) == 0 &&
                    (psVar5 = tmp, tmp->tag == 0x13)))) goto LAB_0012a70a;
                sexp_push_op(psVar4,&defs,tmp);
                psVar5 = sexp_memq_op(psVar4,(sexp)0x0,2,x_00,(local_b8->value).type.dl);
                if (psVar5 == (sexp)&DAT_0000003e) {
                  sexp_push_op(psVar4,&(local_b8->value).type.dl,x_00);
                }
                ppsVar6 = &(psVar3->value).type.cpl;
              }
              if ((((ulong)defs & 3) == 0) && (defs->tag == 6)) {
                if ((((ulong)body & 3) == 0) && (body->tag == 0x21)) {
                  psVar5 = (body->value).type.name;
                }
                else {
                  tmp = sexp_alloc_tagged_aux(ctx2,0x18,0x21);
                  psVar5 = sexp_cons_op(ctx2,(sexp)0x0,2,body,(sexp)&DAT_0000023e);
                  (tmp->value).type.name = psVar5;
                  body = tmp;
                }
                psVar5 = sexp_append2_op(ctx2,(sexp)0x0,2,defs,psVar5);
                (body->value).type.name = psVar5;
                if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x13)) goto LAB_0012a70a;
              }
              psVar5 = body;
              if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
                (local_b8->value).type.slots = psVar5;
                psVar5 = local_b8;
              }
            }
          }
        }
      }
      goto LAB_0012a70a;
    }
    iVar2 = sexp_idp(psVar5);
    if (iVar2 == 0) {
LAB_0012a764:
      message = "non-symbol parameter";
    }
    else {
      psVar5 = sexp_memq_op(ctx,(sexp)0x0,2,psVar5,(((x->value).type.cpl)->value).type.name);
      if (psVar5 == (sexp)&DAT_0000003e) goto LAB_0012a76d;
LAB_0012a75b:
      message = "duplicate parameter";
    }
  }
  else {
    message = "bad lambda syntax";
  }
  psVar5 = sexp_compile_error(ctx,message,x);
LAB_0012a70a:
  (ctx->value).context.saves = local_90.next;
  return psVar5;
}

Assistant:

static sexp analyze_lambda (sexp ctx, sexp x, int depth) {
  int trailing_non_procs, verify_duplicates_p;
  sexp name, ls, ctx3;
  sexp_gc_var6(res, body, tmp, value, defs, ctx2);
  sexp_gc_preserve6(ctx, res, body, tmp, value, defs, ctx2);
  /* verify syntax */
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x))))
    sexp_return(res, sexp_compile_error(ctx, "bad lambda syntax", x));
  verify_duplicates_p = sexp_length_unboxed(sexp_cadr(x)) < 100;
  for (ls=sexp_cadr(x); sexp_pairp(ls); ls=sexp_cdr(ls))
    if (! sexp_idp(sexp_car(ls)))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (verify_duplicates_p && sexp_truep(sexp_memq(ctx, sexp_car(ls), sexp_cdr(ls))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  if (! sexp_nullp(ls)) { /* verify rest param */
    if (! sexp_idp(ls))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (sexp_truep(sexp_memq(ctx, ls, sexp_cadr(x))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  }
  /* build lambda and analyze body */
  res = sexp_make_lambda(ctx, tmp=sexp_copy_list(ctx, sexp_cadr(x)));
  if (sexp_exceptionp(res)) sexp_return(res, res);
  sexp_lambda_source(res) = sexp_pair_source(x);
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cdr(x));
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cddr(x));
  ctx2 = sexp_make_child_context(ctx, res);
  if (sexp_exceptionp(ctx2)) sexp_return(res, ctx2);
  tmp = sexp_flatten_dot(ctx2, sexp_lambda_params(res));
  sexp_context_env(ctx2) = sexp_extend_env(ctx2, sexp_context_env(ctx2), tmp, res);
  if (sexp_exceptionp(sexp_context_env(ctx2))) sexp_return(res, sexp_context_env(ctx2));
  sexp_env_lambda(sexp_context_env(ctx2)) = res;
  body = analyze_seq(ctx2, sexp_cddr(x), depth, 1);
  if (sexp_exceptionp(body)) sexp_return(res, body);
  /* delayed analyze internal defines */
  trailing_non_procs = 0;
  defs = SEXP_NULL;
  for (ls=sexp_lambda_defs(res); sexp_pairp(ls); ls=sexp_cdr(ls)) {
    tmp = sexp_car(ls);
    ctx3 = sexp_cdr(tmp);
    if (sexp_pairp(sexp_caar(tmp))) {
      name = sexp_caaar(tmp);
      tmp = sexp_cons(ctx3, sexp_cdaar(tmp), sexp_cdar(tmp));
      tmp = sexp_cons(ctx3, SEXP_VOID, tmp);
      sexp_pair_source(tmp) = sexp_pair_source(sexp_caar(ls));
      value = analyze_lambda(ctx3, tmp, depth);
    } else {
      name = sexp_caar(tmp);
      value = analyze(ctx3, sexp_cadar(tmp), depth, 0);
    }
    if (sexp_exceptionp(value)) sexp_return(res, value);
    if (sexp_lambdap(value)) sexp_lambda_name(value) = name;
    tmp = analyze_var_ref(ctx3, name, NULL);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    tmp = sexp_make_set(ctx3, tmp, value);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    sexp_push(ctx3, defs, tmp);
    if (!sexp_lambdap(value)) trailing_non_procs = 1;
    if (trailing_non_procs || !SEXP_USE_UNBOXED_LOCALS)
      sexp_insert(ctx3, sexp_lambda_sv(res), name);
  }
  if (sexp_pairp(defs)) {
    if (! sexp_seqp(body)) {
      tmp = sexp_alloc_type(ctx2, seq, SEXP_SEQ);
      sexp_seq_ls(tmp) = sexp_list1(ctx2, body);
      body = tmp;
    }
    sexp_seq_ls(body) = sexp_append2(ctx2, defs, sexp_seq_ls(body));
    if (sexp_exceptionp(sexp_seq_ls(body))) sexp_return(res, sexp_seq_ls(body));
  }
  if (sexp_exceptionp(body)) res = body;
  else sexp_lambda_body(res) = body;
 cleanup:
  sexp_gc_release6(ctx);
  return res;
}